

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

int absl::synchronization_internal::MutexDelay(int32_t c,int mode)

{
  Duration duration;
  uint in_EAX;
  int iVar1;
  int64_t unaff_RBX;
  undefined8 unaff_RBP;
  ScopedEnable enable_rescheduling;
  undefined8 uStackY_18;
  
  uStackY_18._0_4_ = in_EAX;
  anon_unknown_11::GetMutexGlobals();
  if (c < anon_unknown_11::GetMutexGlobals::data.mutex_sleep_limit[mode]) {
    iVar1 = c + 1;
  }
  else {
    uStackY_18 = (ulong)(uint)uStackY_18;
    if (anon_unknown_11::GetMutexGlobals::data.mutex_sleep_limit[mode] == c) {
      AbslInternalMutexYield();
      iVar1 = c + 1;
    }
    else {
      iVar1 = 0;
      duration._8_8_ = unaff_RBP;
      duration.rep_hi_ = unaff_RBX;
      AbslInternalSleepFor(duration);
    }
    base_internal::SchedulingGuard::ScopedEnable::~ScopedEnable
              ((ScopedEnable *)((long)&uStackY_18 + 4));
  }
  return iVar1;
}

Assistant:

int MutexDelay(int32_t c, int mode) {
  const int32_t limit = GetMutexGlobals().mutex_sleep_limit[mode];
  if (c < limit) {
    // Spin.
    c++;
  } else {
    SchedulingGuard::ScopedEnable enable_rescheduling;
    ABSL_TSAN_MUTEX_PRE_DIVERT(nullptr, 0);
    if (c == limit) {
      // Yield once.
      ABSL_INTERNAL_C_SYMBOL(AbslInternalMutexYield)();
      c++;
    } else {
      // Then wait.
      absl::SleepFor(absl::Microseconds(10));
      c = 0;
    }
    ABSL_TSAN_MUTEX_POST_DIVERT(nullptr, 0);
  }
  return c;
}